

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O1

void __thiscall
de::AppendList<vk::DebugReportMessage>::append
          (AppendList<vk::DebugReportMessage> *this,DebugReportMessage *value)

{
  size_t *psVar1;
  ulong uVar2;
  size_t sVar3;
  DebugReportMessage *pDVar4;
  pointer pcVar5;
  VkDebugReportFlagsEXT VVar6;
  VkDebugReportObjectTypeEXT VVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  deInt32 dVar10;
  deUint64 dVar11;
  ulong uVar12;
  Block *pBVar13;
  DebugReportMessage *pDVar14;
  ulong uVar15;
  Block *pBVar16;
  
  pBVar16 = this->m_last;
  LOCK();
  psVar1 = &this->m_numElements;
  uVar15 = *psVar1;
  *psVar1 = *psVar1 + 1;
  UNLOCK();
  uVar12 = uVar15 / this->m_blockSize;
  uVar15 = uVar15 % this->m_blockSize;
  uVar2 = pBVar16->blockNdx;
  while (uVar2 != uVar12) {
    if (pBVar16->next == (Block *)0x0) {
      deYield();
    }
    else {
      pBVar16 = pBVar16->next;
    }
    uVar2 = pBVar16->blockNdx;
  }
  sVar3 = this->m_blockSize;
  if (uVar15 + 1 == sVar3) {
    pBVar13 = (Block *)operator_new(0x18);
    pBVar13->blockNdx = uVar12 + 1;
    pDVar14 = (DebugReportMessage *)deAlignedMalloc(sVar3 * 0x60,8);
    pBVar13->elements = pDVar14;
    pBVar13->next = (Block *)0x0;
    this->m_last = pBVar13;
    pBVar16->next = pBVar13;
  }
  pDVar4 = pBVar16->elements;
  VVar6 = value->flags;
  VVar7 = value->objectType;
  dVar11 = value->object;
  uVar8 = *(undefined4 *)((long)&value->object + 4);
  sVar3 = value->location;
  uVar9 = *(undefined4 *)((long)&value->location + 4);
  dVar10 = value->messageCode;
  pDVar14 = pDVar4 + uVar15;
  *(undefined4 *)((long)&pDVar14->object + 4) = *(undefined4 *)((long)&value->object + 4);
  *(int *)&pDVar14->location = (int)sVar3;
  *(undefined4 *)((long)&pDVar14->location + 4) = uVar9;
  pDVar14->messageCode = dVar10;
  pDVar14->flags = VVar6;
  pDVar14->objectType = VVar7;
  *(int *)&pDVar14->object = (int)dVar11;
  *(undefined4 *)((long)&pDVar14->object + 4) = uVar8;
  pDVar4[uVar15].layerPrefix._M_dataplus._M_p = (pointer)&pDVar4[uVar15].layerPrefix.field_2;
  pcVar5 = (value->layerPrefix)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pDVar14->layerPrefix,pcVar5,pcVar5 + (value->layerPrefix)._M_string_length);
  pDVar4[uVar15].message._M_dataplus._M_p = (pointer)&pDVar4[uVar15].message.field_2;
  pcVar5 = (value->message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pDVar4[uVar15].message,pcVar5,pcVar5 + (value->message)._M_string_length);
  return;
}

Assistant:

void AppendList<ElementType>::append (const ElementType& value)
{
	// Fetch curBlock first before allocating slot. Otherwise m_last might get updated before
	// this thread gets chance of reading it, leading to curBlock->blockNdx > blockNdx.
	Block*			curBlock	= m_last;

	deMemoryReadWriteFence();

	{
		const size_t	elementNdx	= deAtomicIncrementUSize(&m_numElements) - 1;
		const size_t	blockNdx	= elementNdx / m_blockSize;
		const size_t	slotNdx		= elementNdx - (blockNdx * m_blockSize);

		while (curBlock->blockNdx != blockNdx)
		{
			if (curBlock->next)
				curBlock = curBlock->next;
			else
			{
				// Other thread(s) are currently allocating additional block(s)
				deYield();
			}
		}

		// Did we allocate last slot? If so, add a new block
		if (slotNdx+1 == m_blockSize)
		{
			Block* const	newBlock	= new Block(blockNdx+1, m_blockSize);

			deMemoryReadWriteFence();

			// At this point if any other thread is trying to allocate more blocks
			// they are being blocked by curBlock->next being null. This guarantees
			// that this thread has exclusive modify access to m_last.
			m_last = newBlock;
			deMemoryReadWriteFence();

			// At this point other threads might have skipped to newBlock, but we
			// still have exclusive modify access to curBlock->next.
			curBlock->next = newBlock;
			deMemoryReadWriteFence();
		}

		new (&curBlock->elements[slotNdx]) ElementType(value);
	}
}